

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5IterSetOutputs_Nocolset(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  int iVar1;
  u8 *puVar2;
  
  (pIter->base).iRowid = pSeg->iRowid;
  iVar1 = pSeg->nPos;
  (pIter->base).nData = iVar1;
  if (pSeg->pLeaf->szLeaf < iVar1 + pSeg->iLeafOffset) {
    (pIter->poslist).n = 0;
    fts5SegiterPoslist(pIter->pIndex,pSeg,(Fts5Colset *)0x0,&pIter->poslist);
    puVar2 = (pIter->poslist).p;
  }
  else {
    puVar2 = pSeg->pLeaf->p + pSeg->iLeafOffset;
  }
  (pIter->base).pData = puVar2;
  return;
}

Assistant:

static void fts5IterSetOutputs_Nocolset(Fts5Iter *pIter, Fts5SegIter *pSeg){
  pIter->base.iRowid = pSeg->iRowid;
  pIter->base.nData = pSeg->nPos;

  assert( pIter->pIndex->pConfig->eDetail!=FTS5_DETAIL_NONE );
  assert( pIter->pColset==0 );

  if( pSeg->iLeafOffset+pSeg->nPos<=pSeg->pLeaf->szLeaf ){
    /* All data is stored on the current page. Populate the output 
    ** variables to point into the body of the page object. */
    pIter->base.pData = &pSeg->pLeaf->p[pSeg->iLeafOffset];
  }else{
    /* The data is distributed over two or more pages. Copy it into the
    ** Fts5Iter.poslist buffer and then set the output pointer to point
    ** to this buffer.  */
    fts5BufferZero(&pIter->poslist);
    fts5SegiterPoslist(pIter->pIndex, pSeg, 0, &pIter->poslist);
    pIter->base.pData = pIter->poslist.p;
  }
}